

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O0

void If_ManComputeRequired(If_Man_t *p)

{
  Tim_Man_t *pTVar1;
  int iVar2;
  int iVar3;
  If_Obj_t *pIVar4;
  If_Obj_t *pIVar5;
  If_Cut_t *pIVar6;
  char *pcVar7;
  float fVar8;
  float local_f8;
  uint local_20;
  float reqTime;
  int Counter;
  int i;
  If_Obj_t *pObj;
  If_Man_t *p_local;
  
  If_ManMarkMapping(p);
  if (p->pManTim == (Tim_Man_t *)0x0) {
    fVar8 = If_ManDelayMax(p,0);
    p->RequiredGlo = fVar8;
    if ((p->pPars->pTimesReq == (float *)0x0) || (p->pPars->fAreaOnly != 0)) {
      if ((p->pPars->nRelaxRatio != 0) &&
         ((fVar8 = p->pPars->DelayTargetNew, fVar8 == 0.0 && (!NAN(fVar8))))) {
        p->pPars->DelayTargetNew = (p->RequiredGlo * ((float)p->pPars->nRelaxRatio + 100.0)) / 100.0
        ;
      }
      fVar8 = p->pPars->DelayTarget;
      if ((fVar8 != -1.0) || (NAN(fVar8))) {
        if (p->RequiredGlo <= p->pPars->DelayTarget + p->fEpsilon) {
          if (p->RequiredGlo < p->pPars->DelayTarget - p->fEpsilon) {
            if (p->fNextRound == 0) {
              p->fNextRound = 1;
            }
            p->RequiredGlo = p->pPars->DelayTarget;
          }
        }
        else if (p->fNextRound == 0) {
          p->fNextRound = 1;
          Abc_Print(0,"Cannot meet the target required times (%4.2f). Mapping continues anyway.\n",
                    (double)p->pPars->DelayTarget);
        }
      }
      else if (0.0 < p->pPars->DelayTargetNew) {
        p->RequiredGlo = p->pPars->DelayTargetNew;
      }
      if (p->pPars->fAreaOnly != 0) {
        return;
      }
      if (p->pPars->fDoAverage == 0) {
        if (p->pPars->fLatchPaths == 0) {
          for (reqTime = 0.0; iVar2 = Vec_PtrSize(p->vCos), (int)reqTime < iVar2;
              reqTime = (float)((int)reqTime + 1)) {
            pIVar4 = (If_Obj_t *)Vec_PtrEntry(p->vCos,(int)reqTime);
            fVar8 = p->RequiredGlo;
            pIVar4 = If_ObjFanin0(pIVar4);
            pIVar4->Required = fVar8;
          }
        }
        else {
          iVar2 = If_ManCoNum(p);
          for (reqTime = (float)(iVar2 - p->pPars->nLatchesCo); iVar2 = Vec_PtrSize(p->vCos),
              (int)reqTime < iVar2; reqTime = (float)((int)reqTime + 1)) {
            pIVar4 = (If_Obj_t *)Vec_PtrEntry(p->vCos,(int)reqTime);
            fVar8 = p->RequiredGlo;
            pIVar4 = If_ObjFanin0(pIVar4);
            pIVar4->Required = fVar8;
          }
        }
      }
      else if (p->pPars->nRelaxRatio == 0) {
        for (reqTime = 0.0; iVar2 = Vec_PtrSize(p->vCos), (int)reqTime < iVar2;
            reqTime = (float)((int)reqTime + 1)) {
          pIVar4 = (If_Obj_t *)Vec_PtrEntry(p->vCos,(int)reqTime);
          pIVar5 = If_ObjFanin0(pIVar4);
          fVar8 = If_ObjArrTime(pIVar5);
          pIVar4 = If_ObjFanin0(pIVar4);
          pIVar4->Required = fVar8;
        }
      }
      else {
        for (reqTime = 0.0; iVar2 = Vec_PtrSize(p->vCos), (int)reqTime < iVar2;
            reqTime = (float)((int)reqTime + 1)) {
          pIVar4 = (If_Obj_t *)Vec_PtrEntry(p->vCos,(int)reqTime);
          pIVar5 = If_ObjFanin0(pIVar4);
          fVar8 = If_ObjArrTime(pIVar5);
          iVar2 = p->pPars->nRelaxRatio;
          pIVar4 = If_ObjFanin0(pIVar4);
          pIVar4->Required = (fVar8 * ((float)iVar2 + 100.0)) / 100.0;
        }
      }
    }
    else {
      local_20 = 0;
      for (reqTime = 0.0; iVar2 = Vec_PtrSize(p->vCos), (int)reqTime < iVar2;
          reqTime = (float)((int)reqTime + 1)) {
        pIVar4 = (If_Obj_t *)Vec_PtrEntry(p->vCos,(int)reqTime);
        pIVar5 = If_ObjFanin0(pIVar4);
        fVar8 = If_ObjArrTime(pIVar5);
        if (fVar8 <= p->pPars->pTimesReq[(int)reqTime] + p->fEpsilon) {
          fVar8 = p->pPars->pTimesReq[(int)reqTime];
          pIVar4 = If_ObjFanin0(pIVar4);
          pIVar4->Required = fVar8;
        }
        else {
          pIVar5 = If_ObjFanin0(pIVar4);
          fVar8 = If_ObjArrTime(pIVar5);
          pIVar4 = If_ObjFanin0(pIVar4);
          pIVar4->Required = fVar8;
          local_20 = local_20 + 1;
        }
      }
      if ((local_20 != 0) && (p->fReqTimeWarn == 0)) {
        pcVar7 = "";
        if (1 < (int)local_20) {
          pcVar7 = "s";
        }
        Abc_Print(0,
                  "Required times are exceeded at %d output%s. The earliest arrival times are used.\n"
                  ,(ulong)local_20,pcVar7);
        p->fReqTimeWarn = 1;
      }
    }
    for (reqTime = 0.0; iVar2 = Vec_PtrSize(p->vObjsRev), (int)reqTime < iVar2;
        reqTime = (float)((int)reqTime + 1)) {
      pIVar4 = (If_Obj_t *)Vec_PtrEntry(p->vObjsRev,(int)reqTime);
      if (pIVar4->nRefs != 0) {
        pIVar6 = If_ObjCutBest(pIVar4);
        If_CutPropagateRequired(p,pIVar4,pIVar6,pIVar4->Required);
      }
    }
  }
  else {
    fVar8 = If_ManDelayMax(p,0);
    p->RequiredGlo = fVar8;
    if (((p->pPars->nRelaxRatio != 0) && (fVar8 = p->pPars->DelayTargetNew, fVar8 == 0.0)) &&
       (!NAN(fVar8))) {
      p->pPars->DelayTargetNew = (p->RequiredGlo * ((float)p->pPars->nRelaxRatio + 100.0)) / 100.0;
    }
    fVar8 = p->pPars->DelayTarget;
    if ((fVar8 != -1.0) || (NAN(fVar8))) {
      if (p->RequiredGlo <= p->pPars->DelayTarget + p->fEpsilon) {
        if (p->RequiredGlo < p->pPars->DelayTarget - p->fEpsilon) {
          if (p->fNextRound == 0) {
            p->fNextRound = 1;
          }
          p->RequiredGlo = p->pPars->DelayTarget;
        }
      }
      else if (p->fNextRound == 0) {
        p->fNextRound = 1;
        Abc_Print(0,"Cannot meet the target required times (%4.2f). Mapping continues anyway.\n",
                  (double)p->pPars->DelayTarget);
      }
    }
    else if (0.0 < p->pPars->DelayTargetNew) {
      p->RequiredGlo = p->pPars->DelayTargetNew;
    }
    if (p->pPars->fAreaOnly == 0) {
      Tim_ManIncrementTravId(p->pManTim);
      if (p->vCoAttrs == (Vec_Int_t *)0x0) {
        if (p->pPars->fDoAverage == 0) {
          if (p->pPars->fLatchPaths == 0) {
            Tim_ManInitPoRequiredAll(p->pManTim,p->RequiredGlo);
          }
          else {
            for (reqTime = (float)p->pPars->nLatchesCoBox; iVar2 = If_ManCoNum(p),
                (int)reqTime < iVar2 - p->pPars->nLatchesCo; reqTime = (float)((int)reqTime + 1)) {
              Vec_PtrEntry(p->vCos,(int)reqTime);
              Tim_ManSetCoRequired(p->pManTim,(int)reqTime,1e+20);
            }
            iVar2 = If_ManCoNum(p);
            for (reqTime = (float)(iVar2 - p->pPars->nLatchesCo); iVar2 = Vec_PtrSize(p->vCos),
                (int)reqTime < iVar2; reqTime = (float)((int)reqTime + 1)) {
              Vec_PtrEntry(p->vCos,(int)reqTime);
              Tim_ManSetCoRequired(p->pManTim,(int)reqTime,p->RequiredGlo);
            }
          }
        }
        else if (p->pPars->nRelaxRatio == 0) {
          for (reqTime = 0.0; iVar2 = Vec_PtrSize(p->vCos), (int)reqTime < iVar2;
              reqTime = (float)((int)reqTime + 1)) {
            pIVar4 = (If_Obj_t *)Vec_PtrEntry(p->vCos,(int)reqTime);
            pTVar1 = p->pManTim;
            pIVar4 = If_ObjFanin0(pIVar4);
            fVar8 = If_ObjArrTime(pIVar4);
            Tim_ManSetCoRequired(pTVar1,(int)reqTime,fVar8);
          }
        }
        else {
          for (reqTime = 0.0; iVar2 = Vec_PtrSize(p->vCos), (int)reqTime < iVar2;
              reqTime = (float)((int)reqTime + 1)) {
            pIVar4 = (If_Obj_t *)Vec_PtrEntry(p->vCos,(int)reqTime);
            pTVar1 = p->pManTim;
            pIVar4 = If_ObjFanin0(pIVar4);
            fVar8 = If_ObjArrTime(pIVar4);
            Tim_ManSetCoRequired
                      (pTVar1,(int)reqTime,(fVar8 * ((float)p->pPars->nRelaxRatio + 100.0)) / 100.0)
            ;
          }
        }
      }
      else {
        iVar2 = If_ManCoNum(p);
        iVar3 = Vec_IntSize(p->vCoAttrs);
        if (iVar2 != iVar3) {
          __assert_fail("If_ManCoNum(p) == Vec_IntSize(p->vCoAttrs)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                        ,0x1c3,"void If_ManComputeRequired(If_Man_t *)");
        }
        for (reqTime = 0.0; iVar2 = Vec_PtrSize(p->vCos), (int)reqTime < iVar2;
            reqTime = (float)((int)reqTime + 1)) {
          pIVar4 = (If_Obj_t *)Vec_PtrEntry(p->vCos,(int)reqTime);
          iVar2 = Vec_IntEntry(p->vCoAttrs,(int)reqTime);
          if (iVar2 != -1) {
            iVar2 = Vec_IntEntry(p->vCoAttrs,(int)reqTime);
            if (iVar2 == 0) {
              Tim_ManSetCoRequired(p->pManTim,(int)reqTime,p->RequiredGlo);
            }
            else {
              iVar2 = Vec_IntEntry(p->vCoAttrs,(int)reqTime);
              if (iVar2 == 1) {
                pTVar1 = p->pManTim;
                pIVar4 = If_ObjFanin0(pIVar4);
                fVar8 = If_ObjArrTime(pIVar4);
                Tim_ManSetCoRequired(pTVar1,(int)reqTime,fVar8);
              }
              else {
                iVar2 = Vec_IntEntry(p->vCoAttrs,(int)reqTime);
                if (iVar2 != 2) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                                ,0x1ce,"void If_ManComputeRequired(If_Man_t *)");
                }
                Tim_ManSetCoRequired(p->pManTim,(int)reqTime,1e+20);
              }
            }
          }
        }
      }
      for (reqTime = 0.0; iVar2 = Vec_PtrSize(p->vObjsRev), (int)reqTime < iVar2;
          reqTime = (float)((int)reqTime + 1)) {
        pIVar4 = (If_Obj_t *)Vec_PtrEntry(p->vObjsRev,(int)reqTime);
        iVar2 = If_ObjIsAnd(pIVar4);
        if (iVar2 == 0) {
          iVar2 = If_ObjIsCi(pIVar4);
          if (iVar2 == 0) {
            iVar2 = If_ObjIsCo(pIVar4);
            if (iVar2 == 0) {
              iVar2 = If_ObjIsConst1(pIVar4);
              if (iVar2 == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                              ,0x202,"void If_ManComputeRequired(If_Man_t *)");
              }
            }
            else {
              local_f8 = Tim_ManGetCoRequired(p->pManTim,pIVar4->IdPio);
              pIVar5 = If_ObjFanin0(pIVar4);
              if (pIVar5->Required <= local_f8) {
                pIVar5 = If_ObjFanin0(pIVar4);
                local_f8 = pIVar5->Required;
              }
              pIVar4 = If_ObjFanin0(pIVar4);
              pIVar4->Required = local_f8;
            }
          }
          else {
            Tim_ManSetCiRequired(p->pManTim,pIVar4->IdPio,pIVar4->Required);
          }
        }
        else if (pIVar4->nRefs != 0) {
          pIVar6 = If_ObjCutBest(pIVar4);
          If_CutPropagateRequired(p,pIVar4,pIVar6,pIVar4->Required);
        }
      }
    }
  }
  return;
}

Assistant:

void If_ManComputeRequired( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i, Counter;
    float reqTime;

    // compute area, clean required times, collect nodes used in the mapping
//    p->AreaGlo = If_ManScanMapping( p );
    If_ManMarkMapping( p );
    if ( p->pManTim == NULL )
    {
        // get the global required times
        p->RequiredGlo = If_ManDelayMax( p, 0 );

        // consider the case when the required times are given
        if ( p->pPars->pTimesReq && !p->pPars->fAreaOnly )
        {
            // make sure that the required time hold
            Counter = 0;
            If_ManForEachCo( p, pObj, i )
            {
                if ( If_ObjArrTime(If_ObjFanin0(pObj)) > p->pPars->pTimesReq[i] + p->fEpsilon )
                {
                    If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj));
                    Counter++;
    //                Abc_Print( 0, "Required times are violated for output %d (arr = %d; req = %d).\n", 
    //                    i, (int)If_ObjArrTime(If_ObjFanin0(pObj)), (int)p->pPars->pTimesReq[i] );
                }
                else
                    If_ObjFanin0(pObj)->Required = p->pPars->pTimesReq[i];
            }
            if ( Counter && !p->fReqTimeWarn )
            {
                Abc_Print( 0, "Required times are exceeded at %d output%s. The earliest arrival times are used.\n", Counter, Counter > 1 ? "s":"" );
                p->fReqTimeWarn = 1;
            }
        }
        else
        {
            // find new delay target
            if ( p->pPars->nRelaxRatio && p->pPars->DelayTargetNew == 0 )
                p->pPars->DelayTargetNew = p->RequiredGlo * (100.0 + p->pPars->nRelaxRatio) / 100.0; 

            // update the required times according to the target
            if ( p->pPars->DelayTarget != -1 )
            {
                if ( p->RequiredGlo > p->pPars->DelayTarget + p->fEpsilon )
                {
                    if ( p->fNextRound == 0 )
                    {
                        p->fNextRound = 1;
                        Abc_Print( 0, "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n", p->pPars->DelayTarget );
                    }
                }
                else if ( p->RequiredGlo < p->pPars->DelayTarget - p->fEpsilon )
                {
                    if ( p->fNextRound == 0 )
                    {
                        p->fNextRound = 1;
//                        Abc_Print( 0, "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->RequiredGlo, p->pPars->DelayTarget );
                    }
                    p->RequiredGlo = p->pPars->DelayTarget;
                }
            }
            else if ( p->pPars->DelayTargetNew > 0 ) // relax the required times 
                p->RequiredGlo = p->pPars->DelayTargetNew;
            // do not propagate required times if area minimization is requested
            if ( p->pPars->fAreaOnly ) 
                return;
            // set the required times for the POs
            if ( p->pPars->fDoAverage )
            {
                if ( p->pPars->nRelaxRatio )
                {
                    If_ManForEachCo( p, pObj, i )
                        If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj)) * (100.0 + p->pPars->nRelaxRatio) / 100.0;
                }
                else
                {
                    If_ManForEachCo( p, pObj, i )
                        If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj));
                }
            }
            else if ( p->pPars->fLatchPaths )
            {
                If_ManForEachLatchInput( p, pObj, i )
                    If_ObjFanin0(pObj)->Required = p->RequiredGlo;
            }
            else 
            {
                If_ManForEachCo( p, pObj, i )
                    If_ObjFanin0(pObj)->Required = p->RequiredGlo;
            }
        }
        // go through the nodes in the reverse topological order
    //    Vec_PtrForEachEntry( If_Obj_t *, p->vMapped, pObj, i )
    //        If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
        If_ManForEachObjReverse( p, pObj, i )
        {
            if ( pObj->nRefs == 0 )
                continue;
            If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
        }
    }
    else
    {
        // get the global required times
        p->RequiredGlo = If_ManDelayMax( p, 0 );

        // find new delay target
        if ( p->pPars->nRelaxRatio && p->pPars->DelayTargetNew == 0 )
            p->pPars->DelayTargetNew = p->RequiredGlo * (100.0 + p->pPars->nRelaxRatio) / 100.0; 

        // update the required times according to the target
        if ( p->pPars->DelayTarget != -1 )
        {
            if ( p->RequiredGlo > p->pPars->DelayTarget + p->fEpsilon )
            {
                if ( p->fNextRound == 0 )
                {
                    p->fNextRound = 1;
                    Abc_Print( 0, "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n", p->pPars->DelayTarget );
                }
            }
            else if ( p->RequiredGlo < p->pPars->DelayTarget - p->fEpsilon )
            {
                if ( p->fNextRound == 0 )
                {
                    p->fNextRound = 1;
//                    Abc_Print( 0, "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->RequiredGlo, p->pPars->DelayTarget );
                }
                p->RequiredGlo = p->pPars->DelayTarget;
            }
        }
        else if ( p->pPars->DelayTargetNew > 0 ) // relax the required times 
            p->RequiredGlo = p->pPars->DelayTargetNew;

        // do not propagate required times if area minimization is requested
        if ( p->pPars->fAreaOnly ) 
            return;
        // set the required times for the POs
        Tim_ManIncrementTravId( p->pManTim );
        if ( p->vCoAttrs )
        {
            assert( If_ManCoNum(p) == Vec_IntSize(p->vCoAttrs) );
            If_ManForEachCo( p, pObj, i )
            { 
                if ( Vec_IntEntry(p->vCoAttrs, i) == -1 )       // -1=internal
                    continue;
                if ( Vec_IntEntry(p->vCoAttrs, i) == 0 )        //  0=optimize
                    Tim_ManSetCoRequired( p->pManTim, i, p->RequiredGlo );
                else if ( Vec_IntEntry(p->vCoAttrs, i) == 1 )   //  1=keep
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) );
                else if ( Vec_IntEntry(p->vCoAttrs, i) == 2 )   //  2=relax
                    Tim_ManSetCoRequired( p->pManTim, i, IF_FLOAT_LARGE );
                else assert( 0 );
            }
        }
        else if ( p->pPars->fDoAverage )
        {
            if ( p->pPars->nRelaxRatio )
            {
                If_ManForEachCo( p, pObj, i )
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) * (100.0 + p->pPars->nRelaxRatio) / 100.0 );
            }
            else
            {
                If_ManForEachCo( p, pObj, i )
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) );
            }
        }
        else if ( p->pPars->fLatchPaths )
        {
            If_ManForEachPo( p, pObj, i )
                Tim_ManSetCoRequired( p->pManTim, i, IF_FLOAT_LARGE );
            If_ManForEachLatchInput( p, pObj, i )
                Tim_ManSetCoRequired( p->pManTim, i, p->RequiredGlo );
        }
        else  
        {
            Tim_ManInitPoRequiredAll( p->pManTim, p->RequiredGlo );
//            If_ManForEachCo( p, pObj, i )
//                Tim_ManSetCoRequired( p->pManTim, pObj->IdPio, p->RequiredGlo );
        }
        // go through the nodes in the reverse topological order
        If_ManForEachObjReverse( p, pObj, i )
        {
            if ( If_ObjIsAnd(pObj) )
            {
                if ( pObj->nRefs == 0 )
                    continue;
                If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
            }
            else if ( If_ObjIsCi(pObj) )
            {
                reqTime = pObj->Required;
                Tim_ManSetCiRequired( p->pManTim, pObj->IdPio, reqTime );
            }
            else if ( If_ObjIsCo(pObj) )
            {
                reqTime = Tim_ManGetCoRequired( p->pManTim, pObj->IdPio );
                If_ObjFanin0(pObj)->Required = IF_MIN( reqTime, If_ObjFanin0(pObj)->Required );
            }
            else if ( If_ObjIsConst1(pObj) )
            {
            }
            else // add the node to the mapper
                assert( 0 );
        }
    }
}